

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

int cpool_do_conn(Curl_easy *data,connectdata *conn,void *param)

{
  cpool_do_conn_ctx *dctx;
  bool bVar1;
  
  bVar1 = conn->connection_id == *param;
  if (bVar1) {
    (**(code **)((long)param + 8))(conn,data,*(undefined8 *)((long)param + 0x10));
  }
  return (uint)bVar1;
}

Assistant:

static int cpool_do_conn(struct Curl_easy *data,
                         struct connectdata *conn, void *param)
{
  struct cpool_do_conn_ctx *dctx = param;
  (void)data;
  if(conn->connection_id == dctx->id) {
    dctx->cb(conn, data, dctx->cbdata);
    return 1;
  }
  return 0;
}